

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_int>
          (Memory *this,u32 offset,u32 addend,uint expect,uint replace,uint *out)

{
  Result RVar1;
  Enum EVar2;
  uint read;
  uint *local_38;
  
  local_38 = out;
  RVar1 = AtomicLoad<unsigned_int>(this,offset,addend,&read);
  EVar2 = Error;
  if ((RVar1.enum_ != Error) &&
     ((read != expect ||
      (RVar1 = AtomicStore<unsigned_int>(this,offset,addend,replace), RVar1.enum_ != Error)))) {
    *local_38 = read;
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u32 offset,
                                u32 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}